

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astMessageChainNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  ulong uVar2;
  ulong uVar3;
  sysbvm_tuple_t slotCount;
  sysbvm_tuple_t sVar4;
  anon_struct_80_10_98a2f1d2 gcFrame_1;
  anon_struct_24_3_13565e4c gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord_1;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  long local_208;
  sysbvm_tuple_t sStack_200;
  sysbvm_tuple_t local_1f8;
  sysbvm_tuple_t sStack_1f0;
  sysbvm_tuple_t local_1e8;
  sysbvm_tuple_t sStack_1e0;
  sysbvm_tuple_t local_1d8;
  sysbvm_tuple_t sStack_1d0;
  sysbvm_tuple_t local_1c8;
  sysbvm_tuple_t sStack_1c0;
  sysbvm_tuple_t *local_1b8;
  long lStack_1b0;
  sysbvm_tuple_t local_1a8;
  ulong local_198;
  ulong local_190;
  sysbvm_tuple_t local_188;
  sysbvm_stackFrameRecord_t local_180;
  undefined8 local_170;
  sysbvm_stackFrameRecord_t local_168;
  undefined8 local_158;
  undefined1 *puStack_150;
  sysbvm_stackFrameRecord_t local_148;
  undefined8 local_138;
  anon_struct_136_2_7a050327_for_gcRoots *paStack_130;
  sysbvm_stackFrameRecord_t local_120;
  undefined8 local_110;
  sysbvm_stackFrameRecord_t local_108;
  undefined8 local_f8;
  sysbvm_tuple_t **ppsStack_f0;
  sysbvm_functionCallFrameStack_t local_e8;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  ppsStack_f0 = &local_1b8;
  local_1b8 = (sysbvm_tuple_t *)0x0;
  lStack_1b0 = 0;
  local_1a8 = 0;
  local_108.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_108.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_108._12_4_ = 0;
  local_f8 = 3;
  sysbvm_stackFrame_pushRecord(&local_108);
  local_120.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_120.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_110 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_120);
  sVar4 = *(sysbvm_tuple_t *)(*arguments + 0x28);
  if (sVar4 != 0) {
    local_1b8 = (sysbvm_tuple_t *)
                sysbvm_interpreter_evaluateASTWithEnvironment(context,sVar4,arguments[1]);
  }
  uVar2 = *(ulong *)(*arguments + 0x38);
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    uVar2 = (ulong)(*(uint *)(uVar2 + 0xc) >> 3);
  }
  else {
    uVar2 = 0;
  }
  if (uVar2 != 0) {
    local_198 = (ulong)(sVar4 != 0);
    uVar3 = 0;
    local_190 = uVar2;
    local_188 = sVar4;
    do {
      sVar4 = local_188;
      uVar2 = *(ulong *)(*arguments + 0x38);
      if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
        local_208 = *(long *)(uVar2 + 0x10 + uVar3 * 8);
      }
      else {
        local_208 = 0;
      }
      sStack_200 = 0;
      local_1c8 = 0;
      sStack_1c0 = 0;
      local_1d8 = 0;
      sStack_1d0 = 0;
      local_1e8 = 0;
      sStack_1e0 = 0;
      local_1f8 = 0;
      sStack_1f0 = 0;
      local_168.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_168.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
      local_168._12_4_ = 0;
      local_158 = 10;
      lStack_1b0 = local_208;
      puStack_150 = (undefined1 *)&local_208;
      sysbvm_stackFrame_pushRecord(&local_168);
      local_180.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_180.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
      local_170 = *(undefined8 *)(local_208 + 0x10);
      sysbvm_stackFrame_pushRecord(&local_180);
      uVar2 = *(ulong *)(local_208 + 0x30);
      if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
        slotCount = (sysbvm_tuple_t)(*(uint *)(uVar2 + 0xc) >> 3);
      }
      else {
        slotCount = 0;
      }
      local_1f8 = sysbvm_interpreter_evaluateASTWithEnvironment
                            (context,*(sysbvm_tuple_t *)(local_208 + 0x28),arguments[1]);
      if (sVar4 == 0) {
        _Var1 = sysbvm_environment_lookSymbolRecursively(context,arguments[1],local_1f8,&sStack_1f0)
        ;
        if ((!_Var1) || (_Var1 = sysbvm_symbolBinding_isValue(context,sStack_1f0), !_Var1)) {
          sysbvm_error("Failed to find symbol for message send without receiver.");
        }
        if (((sStack_1f0 & 0xf) == 0 && sStack_1f0 != 0) && (0x57 < *(uint *)(sStack_1f0 + 0xc))) {
          local_1e8 = *(sysbvm_tuple_t *)(sStack_1f0 + 0x38);
        }
        else {
          local_1e8 = 0;
        }
LAB_0012574f:
        memset(&local_e8,0,0xb0);
        local_148.previous = (sysbvm_stackFrameRecord_s *)0x0;
        local_148.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
        local_148._12_4_ = 0;
        local_138 = 0x11;
        paStack_130 = &local_e8.gcRoots;
        sysbvm_stackFrame_pushRecord(&local_148);
        sysbvm_functionCallFrameStack_begin(context,&local_e8,local_1e8,local_198 + slotCount,0);
        if (sVar4 != 0) {
          sysbvm_functionCallFrameStack_push(&local_e8,(sysbvm_tuple_t)local_1b8);
        }
        if (slotCount != 0) {
          sVar4 = 0;
          do {
            uVar2 = *(ulong *)(local_208 + 0x30);
            if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
              local_1d8 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + sVar4 * 8);
            }
            else {
              local_1d8 = 0;
            }
            sStack_1d0 = sysbvm_interpreter_evaluateASTWithEnvironment
                                   (context,local_1d8,arguments[1]);
            sysbvm_functionCallFrameStack_push(&local_e8,sStack_1d0);
            sVar4 = sVar4 + 1;
          } while (slotCount != sVar4);
        }
        sysbvm_stackFrame_popRecord(&local_148);
        sStack_1c0 = sysbvm_functionCallFrameStack_finish(context,&local_e8);
      }
      else {
        uVar2 = (ulong)local_1b8 & 0xf;
        if (uVar2 == 0 && local_1b8 != (sysbvm_tuple_t *)0x0) {
          sStack_200 = *local_1b8;
        }
        else if ((int)uVar2 == 0xf) {
          sStack_200 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_1b8 >> 4);
        }
        else {
          sStack_200 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar2);
        }
        local_1e8 = sysbvm_type_lookupSelector(context,sStack_200,local_1f8);
        if (local_1e8 != 0) goto LAB_0012574f;
        local_1e8 = sysbvm_type_lookupSelector
                              (context,sStack_200,(context->roots).doesNotUnderstandSelector);
        if (local_1e8 == 0) {
          sysbvm_error("Message not understood.");
        }
        sStack_1e0 = sysbvm_array_create(context,slotCount);
        if (slotCount != 0) {
          sVar4 = 0;
          do {
            uVar2 = *(ulong *)(local_208 + 0x30);
            if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
              local_1d8 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + sVar4 * 8);
            }
            else {
              local_1d8 = 0;
            }
            sStack_1d0 = sysbvm_interpreter_evaluateASTWithEnvironment
                                   (context,local_1d8,arguments[1]);
            if ((sStack_1d0 & 0xf) == 0 && sStack_1d0 != 0) {
              *(sysbvm_tuple_t *)(sStack_1d0 + 0x10 + sVar4 * 8) = sStack_1d0;
            }
            sVar4 = sVar4 + 1;
          } while (slotCount != sVar4);
        }
        local_1c8 = sysbvm_message_create
                              (context,local_1f8,sStack_1e0,sStack_200,
                               *(sysbvm_tuple_t *)(local_208 + 0x10));
        local_e8.applicationFlags = (sysbvm_bitflags_t)local_1b8;
        local_e8._8_8_ = local_1c8;
        sStack_1c0 = sysbvm_function_apply(context,local_1e8,2,&local_e8.applicationFlags,1);
      }
      sysbvm_stackFrame_popRecord(&local_180);
      sysbvm_stackFrame_popRecord(&local_168);
      local_1a8 = sStack_1c0;
      uVar3 = uVar3 + 1;
    } while (uVar3 != local_190);
  }
  sysbvm_stackFrame_popRecord(&local_120);
  sysbvm_stackFrame_popRecord(&local_108);
  return local_1a8;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageChainNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMessageChainNode_t **chainNode = (sysbvm_astMessageChainNode_t**)node;

    struct {
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t chainedMessage;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*chainNode)->super.sourcePosition);

    bool hasReceiver = false;
    if((*chainNode)->receiver)
    {
        gcFrame.receiver = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*chainNode)->receiver, *environment);
        hasReceiver = true;
    }

    size_t chainedMessageCount = sysbvm_array_getSize((*chainNode)->messages);
    for(size_t i = 0; i < chainedMessageCount; ++i)
    {
        gcFrame.chainedMessage = sysbvm_array_at((*chainNode)->messages, i);
        gcFrame.result = sysbvm_astMessageChainMessageNode_evaluate(context, gcFrame.chainedMessage, hasReceiver, &gcFrame.receiver, environment);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}